

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderLayeredFramebufferClear::deinit(GeometryShaderLayeredFramebufferClear *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_char_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_char_id);
  }
  if (this->m_fbo_int_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_int_id);
  }
  if (this->m_fbo_uint_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_uint_id);
  }
  if (this->m_to_rgba32i_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_rgba32i_id);
  }
  if (this->m_to_rgba32ui_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_rgba32ui_id);
  }
  if (this->m_to_rgba8_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_rgba8_id);
  }
  if (this->m_read_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_read_fbo_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredFramebufferClear::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_char_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_char_id);
	}

	if (m_fbo_int_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_int_id);
	}

	if (m_fbo_uint_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_uint_id);
	}

	if (m_to_rgba32i_id != 0)
	{
		gl.deleteTextures(1, &m_to_rgba32i_id);
	}

	if (m_to_rgba32ui_id != 0)
	{
		gl.deleteTextures(1, &m_to_rgba32ui_id);
	}

	if (m_to_rgba8_id != 0)
	{
		gl.deleteTextures(1, &m_to_rgba8_id);
	}

	if (m_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_read_fbo_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}